

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Communicator.hpp
# Opt level: O2

void __thiscall
OpenMD::Plan<OpenMD::Vector<double,_7U>_>::Plan
          (Plan<OpenMD::Vector<double,_7U>_> *this,MPI_Comm comm,int nObjects)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int nCommProcs;
  value_type_conflict2 local_28 [2];
  
  (this->displacements).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->displacements).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->displacements).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->myComm = comm;
  MPI_Comm_size(comm,&nCommProcs);
  local_28[1] = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->counts,(long)nCommProcs,local_28 + 1);
  local_28[0] = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->displacements,(long)nCommProcs,local_28);
  this->planSize_ = nObjects * 7;
  MPI_Allgather();
  piVar1 = (this->displacements).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar1 = 0;
  piVar2 = (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = 0;
  for (lVar5 = 1; lVar5 < nCommProcs; lVar5 = lVar5 + 1) {
    iVar6 = iVar6 + piVar2[lVar5 + -1];
    piVar1[lVar5] = iVar6;
  }
  this->size_ = 0;
  piVar1 = (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar3 = (ulong)(uint)nCommProcs;
  if (nCommProcs < 1) {
    uVar3 = uVar4;
  }
  iVar6 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    iVar6 = iVar6 + piVar1[uVar4];
    this->size_ = iVar6;
  }
  return;
}

Assistant:

Plan<T>(MPI_Comm comm, int nObjects) : myComm(comm) {
      int nCommProcs;
      MPI_Comm_size(myComm, &nCommProcs);

      counts.resize(nCommProcs, 0);
      displacements.resize(nCommProcs, 0);

      planSize_ = MPITraits<T>::Length() * nObjects;

      MPI_Allgather(&planSize_, 1, MPI_INT, &counts[0], 1, MPI_INT, myComm);

      displacements[0] = 0;
      for (int i = 1; i < nCommProcs; i++) {
        displacements[i] = displacements[i - 1] + counts[i - 1];
      }

      size_ = 0;
      for (int i = 0; i < nCommProcs; i++) {
        size_ += counts[i];
      }
    }